

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall Js::JavascriptArray::ValidateArrayCommon(JavascriptArray *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  SparseArraySegmentBase *pSVar4;
  SparseArraySegmentBase **ppSVar5;
  undefined4 *puVar6;
  SparseArraySegmentBase *pSVar7;
  ScriptContext *this_00;
  Recycler *recycler;
  SegmentBTreeRoot *this_01;
  ArraySegmentsVisitor local_38;
  ArraySegmentsVisitor visitor;
  SparseArraySegmentBase *next;
  SparseArraySegmentBase *seg;
  bool foundLastUsedSegment;
  SparseArraySegmentBase *lastUsedSegment;
  JavascriptArray *this_local;
  
  pSVar4 = GetLastUsedSegment(this);
  if (((this == (JavascriptArray *)0x0) ||
      (ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                           ((WriteBarrierPtr *)&this->head),
      *ppSVar5 == (SparseArraySegmentBase *)0x0)) || (pSVar4 == (SparseArraySegmentBase *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4c,"(this != nullptr && head && lastUsedSegment)",
                                "Array should not be null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSVar7 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head);
  if (pSVar7->left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4d,"(head->left == 0)",
                                "Array always should have a segment starting at zero");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = false;
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&this->head);
  next = *ppSVar5;
  do {
    if (next == (SparseArraySegmentBase *)0x0) {
      if ((!bVar2) && (bVar2 = HasSegmentMap(this), !bVar2)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e6a,"(foundLastUsedSegment || HasSegmentMap())",
                                    "Corrupt lastUsedSegment in array header");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = HasSegmentMap(this);
      if (bVar2) {
        ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&this->head);
        ArraySegmentsVisitor::ArraySegmentsVisitor(&local_38,*ppSVar5);
        this_01 = GetSegmentMap(this);
        SegmentBTree::Walk<ArraySegmentsVisitor>(&this_01->super_SegmentBTree,&local_38);
      }
      return;
    }
    if (next == pSVar4) {
      bVar2 = true;
    }
    if (next->size < next->length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e59,"(seg->length <= seg->size)",
                                  "Length greater than size not possible");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&next->next);
    visitor.seg = *ppSVar5;
    if (visitor.seg == (SparseArraySegmentBase *)0x0) {
      if (-next->left - 1 < next->length) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e64,"(seg->length <= MaxArrayLength - seg->left)",
                                    "Segment index range overflow");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if ((this->super_ArrayObject).length < next->left + next->length) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e65,"(seg->left + seg->length <= this->length)",
                                    "Segment index range exceeds array length");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    else {
      if ((visitor.seg)->left <= next->left) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e5e,"(seg->left < next->left)",
                                    "Segment is adjacent to or overlaps with next segment");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if ((visitor.seg)->left - next->left < next->size) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e5f,"(seg->size <= (next->left - seg->left))",
                                    "Segment is adjacent to or overlaps with next segment");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      recycler = ScriptContext::GetRecycler(this_00);
      bVar3 = SparseArraySegmentBase::IsLeafSegment(next,recycler);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e60,
                                    "(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()))"
                                    ,"Leaf segment with a next pointer");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    next = visitor.seg;
  } while( true );
}

Assistant:

void JavascriptArray::ValidateArrayCommon()
    {
        SparseArraySegmentBase * lastUsedSegment = this->GetLastUsedSegment();
        AssertMsg(this != nullptr && head && lastUsedSegment, "Array should not be null");
        AssertMsg(head->left == 0, "Array always should have a segment starting at zero");

        // Simple segments validation
        bool foundLastUsedSegment = false;
        SparseArraySegmentBase *seg = head;
        while(seg != nullptr)
        {
            if (seg == lastUsedSegment)
            {
                foundLastUsedSegment = true;
            }

            AssertMsg(seg->length <= seg->size , "Length greater than size not possible");

            SparseArraySegmentBase* next = seg->next;
            if (next != nullptr)
            {
                AssertMsg(seg->left < next->left, "Segment is adjacent to or overlaps with next segment");
                AssertMsg(seg->size <= (next->left - seg->left), "Segment is adjacent to or overlaps with next segment");
                AssertMsg(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()), "Leaf segment with a next pointer");
            }
            else
            {
                AssertMsg(seg->length <= MaxArrayLength - seg->left, "Segment index range overflow");
                AssertMsg(seg->left + seg->length <= this->length, "Segment index range exceeds array length");
            }

            seg = next;
        }
        AssertMsg(foundLastUsedSegment || HasSegmentMap(), "Corrupt lastUsedSegment in array header");

        // Validate segmentMap if present
        if (HasSegmentMap())
        {
            ArraySegmentsVisitor visitor(head);
            GetSegmentMap()->Walk(visitor);
        }
    }